

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QWidgetList * focusPath(QWidget *from,QWidget *to,FocusDirection direction)

{
  long lVar1;
  initializer_list<QWidget_*> args;
  bool bVar2;
  int in_ECX;
  QWidget *in_RDX;
  QWidget *in_RSI;
  QList<QWidget_*> *in_RDI;
  long in_FS_OFFSET;
  QWidget *current;
  QWidgetList path;
  parameter_type in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar3;
  QList<QWidget_*> *pQVar4;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QWidget *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args._M_len._0_4_ = in_stack_ffffffffffffff98;
  args._M_array = (iterator)in_RDI;
  args._M_len._4_4_ = in_stack_ffffffffffffff9c;
  pQVar4 = in_RDI;
  QList<QWidget_*>::QList(in_RDI,args);
  local_30 = in_RSI;
  if (in_RSI == in_RDX) {
    QList<QWidget_*>::QList
              ((QList<QWidget_*> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (QList<QWidget_*> *)in_stack_ffffffffffffff78);
  }
  else {
    do {
      iVar3 = in_ECX;
      if (in_ECX == 0) {
        local_30 = QWidget::previousInFocusChain((QWidget *)(ulong)in_stack_ffffffffffffff80);
      }
      else if (in_ECX == 1) {
        local_30 = QWidget::nextInFocusChain((QWidget *)CONCAT44(1,in_stack_ffffffffffffff80));
      }
      bVar2 = QListSpecialMethodsBase<QWidget*>::contains<QWidget*>
                        ((QListSpecialMethodsBase<QWidget_*> *)
                         CONCAT44(iVar3,in_stack_ffffffffffffff80),
                         (QWidget **)in_stack_ffffffffffffff78);
      if (bVar2) {
        memset(in_RDI,0,0x18);
        QList<QWidget_*>::QList((QList<QWidget_*> *)0x383f1c);
        goto LAB_00383f5c;
      }
      QList<QWidget_*>::operator<<
                ((QList<QWidget_*> *)CONCAT44(iVar3,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
    } while (local_30 != in_RDX);
    QList<QWidget_*>::QList
              ((QList<QWidget_*> *)CONCAT44(iVar3,in_stack_ffffffffffffff80),
               (QList<QWidget_*> *)in_stack_ffffffffffffff78);
  }
LAB_00383f5c:
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x383f66);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

QWidgetList focusPath(QWidget *from, QWidget *to, QWidgetPrivate::FocusDirection direction)
{
    QWidgetList path({from});
    if (from == to)
        return path;

    QWidget *current = from;
    do {
        switch (direction) {
        case QWidgetPrivate::FocusDirection::Previous:
            current = current->previousInFocusChain();
            break;
        case QWidgetPrivate::FocusDirection::Next:
            current = current->nextInFocusChain();
            break;
        }
        if (path.contains(current))
            return QWidgetList();
        path << current;
    } while (current != to);

    return path;
}